

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

connectdata * allocate_conn(Curl_easy *data)

{
  size_t sVar1;
  ssl_backend_data *psVar2;
  void *pvVar3;
  char *pcVar4;
  _Bool _Var5;
  curltime cVar6;
  byte local_53;
  undefined4 uStack_34;
  char *ssl;
  size_t sslsize;
  connectdata *conn;
  Curl_easy *data_local;
  
  data_local = (Curl_easy *)(*Curl_ccalloc)(1,0x758);
  if (data_local == (Curl_easy *)0x0) {
    return (connectdata *)(Curl_easy *)0x0;
  }
  sVar1 = Curl_ssl->sizeof_ssl_backend_data;
  psVar2 = (ssl_backend_data *)(*Curl_ccalloc)(4,sVar1);
  if (psVar2 == (ssl_backend_data *)0x0) {
    (*Curl_cfree)(data_local);
    return (connectdata *)(Curl_easy *)0x0;
  }
  (data_local->set).fclosesocket = (curl_closesocket_callback)psVar2;
  (data_local->set).fread_func_set = (curl_read_callback)psVar2;
  (data_local->set).fxferinfo =
       (curl_xferinfo_callback)((psVar2->tap_state).master_key + (sVar1 - 0x1c));
  (data_local->set).fsockopt =
       (curl_sockopt_callback)((psVar2->tap_state).master_key + sVar1 * 2 + -0x1c);
  (data_local->set).opensocket_client = (psVar2->tap_state).master_key + sVar1 * 3 + -0x1c;
  (data_local->set).mimepost.data = (char *)&Curl_handler_dummy;
  *(curl_socket_t *)&(data_local->set).maxredirs = -1;
  *(curl_socket_t *)((long)&(data_local->set).maxredirs + 4) = -1;
  (data_local->set).keep_post = -1;
  *(undefined4 *)&(data_local->set).free_referer = 0xffffffff;
  *(long *)&(data_local->msg).extmsg = -1;
  (data_local->req).writer_stack = (contenc_writer_s *)0xffffffffffffffff;
  *(int *)&(data_local->req).timeofdoc = -1;
  Curl_conncontrol((connectdata *)data_local,1);
  cVar6 = Curl_now();
  ((curltime *)&(data_local->set).socks5auth)->tv_sec = cVar6.tv_sec;
  (data_local->set).followlocation = CONCAT44(uStack_34,cVar6.tv_usec);
  data_local->next = data;
  *(curl_proxytype *)&(data_local->req).start100.tv_sec = (data->set).proxytype;
  *(curl_proxytype *)&(data_local->req).hbuflen = CURLPROXY_SOCKS4;
  _Var5 = false;
  if ((data->set).str[0x15] != (char *)0x0) {
    _Var5 = *(data->set).str[0x15] != '\0';
  }
  *(_Bool *)((long)&(data_local->set).max_recv_speed + 5) = _Var5;
  _Var5 = false;
  if ((((*(_Bool *)((long)&(data_local->set).max_recv_speed + 5) & 1U) != 0) &&
      (_Var5 = true, *(curl_proxytype *)&(data_local->req).start100.tv_sec != CURLPROXY_HTTP)) &&
     (_Var5 = true, *(curl_proxytype *)&(data_local->req).start100.tv_sec != CURLPROXY_HTTP_1_0)) {
    _Var5 = *(curl_proxytype *)&(data_local->req).start100.tv_sec == CURLPROXY_HTTPS;
  }
  *(_Bool *)((long)&(data_local->set).max_recv_speed + 6) = _Var5;
  local_53 = 0;
  if ((*(_Bool *)((long)&(data_local->set).max_recv_speed + 5) & 1U) != 0) {
    local_53 = *(_Bool *)((long)&(data_local->set).max_recv_speed + 6) ^ 0xff;
  }
  *(bool *)((long)&(data_local->set).max_recv_speed + 7) = (local_53 & 1) != 0;
  if (((data->set).str[0x16] != (char *)0x0) && (*(data->set).str[0x16] != '\0')) {
    *(_Bool *)((long)&(data_local->set).max_recv_speed + 5) = true;
    *(_Bool *)((long)&(data_local->set).max_recv_speed + 7) = true;
  }
  *(bool *)((long)&(data_local->set).set_resume_from + 1) = (data->set).str[0x2c] != (char *)0x0;
  *(byte *)((long)&(data_local->set).headers + 1) = (data->set).tunnel_thru_httpproxy & 1;
  *(bool *)&(data_local->set).set_resume_from = (data->set).str[0x29] != (char *)0x0;
  *(byte *)((long)&(data_local->set).headers + 4) = (data->set).ftp_use_epsv & 1;
  *(byte *)((long)&(data_local->set).headers + 5) = (data->set).ftp_use_eprt & 1;
  *(byte *)((long)&(data_local->set).convfromnetwork + 2) = (data->set).ssl.primary.verifystatus & 1
  ;
  *(byte *)&(data_local->set).convfromnetwork = (data->set).ssl.primary.verifypeer & 1;
  *(byte *)((long)&(data_local->set).convfromnetwork + 1) = (data->set).ssl.primary.verifyhost & 1;
  *(byte *)((long)&(data_local->set).server_response_timeout + 2) =
       (data->set).proxy_ssl.primary.verifystatus & 1;
  *(byte *)&(data_local->set).server_response_timeout = (data->set).proxy_ssl.primary.verifypeer & 1
  ;
  *(byte *)((long)&(data_local->set).server_response_timeout + 1) =
       (data->set).proxy_ssl.primary.verifyhost & 1;
  (data_local->set).mimepost.seekfunc = (curl_seek_callback)(data->set).ipver;
  _Var5 = Curl_pipeline_wanted(data->multi,1);
  if ((_Var5) && (*(long *)((data_local->set).mimepost.encstate.buf + 0x18) == 0)) {
    pvVar3 = (*Curl_ccalloc)(0x4000,1);
    *(void **)((data_local->set).mimepost.encstate.buf + 0x18) = pvVar3;
    if (*(long *)((data_local->set).mimepost.encstate.buf + 0x18) != 0) goto LAB_0012623a;
LAB_0012630a:
    Curl_llist_destroy((curl_llist *)&(data_local->set).mimepost.state.offset,(void *)0x0);
    Curl_llist_destroy((curl_llist *)&(data_local->set).mimepost.encstate.bufend,(void *)0x0);
    (*Curl_cfree)(*(void **)((data_local->set).mimepost.encstate.buf + 0x18));
    (*Curl_cfree)((data_local->set).proxy_ssl.key);
    (*Curl_cfree)((data_local->set).fclosesocket);
    (*Curl_cfree)(data_local);
    data_local = (Curl_easy *)0x0;
  }
  else {
LAB_0012623a:
    Curl_llist_init((curl_llist *)&(data_local->set).mimepost.state.offset,llist_dtor);
    Curl_llist_init((curl_llist *)&(data_local->set).mimepost.encstate.bufend,llist_dtor);
    if ((data->set).str[8] != (char *)0x0) {
      pcVar4 = (*Curl_cstrdup)((data->set).str[8]);
      (data_local->set).proxy_ssl.key = pcVar4;
      if ((data_local->set).proxy_ssl.key == (char *)0x0) goto LAB_0012630a;
    }
    *(int *)((long)&(data_local->set).proxy_ssl.key_type + 4) = (data->set).localportrange;
    *(unsigned_short *)&(data_local->set).proxy_ssl.key_type = (data->set).localport;
    (data_local->msg).list.ptr = (data->set).fclosesocket;
    (data_local->msg).list.prev = (curl_llist_element *)(data->set).closesocket_client;
  }
  return (connectdata *)data_local;
}

Assistant:

static struct connectdata *allocate_conn(struct Curl_easy *data)
{
  struct connectdata *conn = calloc(1, sizeof(struct connectdata));
  if(!conn)
    return NULL;

#ifdef USE_SSL
  /* The SSL backend-specific data (ssl_backend_data) objects are allocated as
     a separate array to ensure suitable alignment.
     Note that these backend pointers can be swapped by vtls (eg ssl backend
     data becomes proxy backend data). */
  {
    size_t sslsize = Curl_ssl->sizeof_ssl_backend_data;
    char *ssl = calloc(4, sslsize);
    if(!ssl) {
      free(conn);
      return NULL;
    }
    conn->ssl_extra = ssl;
    conn->ssl[0].backend = (void *)ssl;
    conn->ssl[1].backend = (void *)(ssl + sslsize);
    conn->proxy_ssl[0].backend = (void *)(ssl + 2 * sslsize);
    conn->proxy_ssl[1].backend = (void *)(ssl + 3 * sslsize);
  }
#endif

  conn->handler = &Curl_handler_dummy;  /* Be sure we have a handler defined
                                           already from start to avoid NULL
                                           situations and checks */

  /* and we setup a few fields in case we end up actually using this struct */

  conn->sock[FIRSTSOCKET] = CURL_SOCKET_BAD;     /* no file descriptor */
  conn->sock[SECONDARYSOCKET] = CURL_SOCKET_BAD; /* no file descriptor */
  conn->tempsock[0] = CURL_SOCKET_BAD; /* no file descriptor */
  conn->tempsock[1] = CURL_SOCKET_BAD; /* no file descriptor */
  conn->connection_id = -1;    /* no ID */
  conn->port = -1; /* unknown at this point */
  conn->remote_port = -1; /* unknown at this point */
#if defined(USE_RECV_BEFORE_SEND_WORKAROUND) && defined(DEBUGBUILD)
  conn->postponed[0].bindsock = CURL_SOCKET_BAD; /* no file descriptor */
  conn->postponed[1].bindsock = CURL_SOCKET_BAD; /* no file descriptor */
#endif /* USE_RECV_BEFORE_SEND_WORKAROUND && DEBUGBUILD */

  /* Default protocol-independent behavior doesn't support persistent
     connections, so we set this to force-close. Protocols that support
     this need to set this to FALSE in their "curl_do" functions. */
  connclose(conn, "Default to force-close");

  /* Store creation time to help future close decision making */
  conn->created = Curl_now();

  conn->data = data; /* Setup the association between this connection
                        and the Curl_easy */

  conn->http_proxy.proxytype = data->set.proxytype;
  conn->socks_proxy.proxytype = CURLPROXY_SOCKS4;

#ifdef CURL_DISABLE_PROXY

  conn->bits.proxy = FALSE;
  conn->bits.httpproxy = FALSE;
  conn->bits.socksproxy = FALSE;
  conn->bits.proxy_user_passwd = FALSE;
  conn->bits.tunnel_proxy = FALSE;

#else /* CURL_DISABLE_PROXY */

  /* note that these two proxy bits are now just on what looks to be
     requested, they may be altered down the road */
  conn->bits.proxy = (data->set.str[STRING_PROXY] &&
                      *data->set.str[STRING_PROXY]) ? TRUE : FALSE;
  conn->bits.httpproxy = (conn->bits.proxy &&
                          (conn->http_proxy.proxytype == CURLPROXY_HTTP ||
                           conn->http_proxy.proxytype == CURLPROXY_HTTP_1_0 ||
                           conn->http_proxy.proxytype == CURLPROXY_HTTPS)) ?
                           TRUE : FALSE;
  conn->bits.socksproxy = (conn->bits.proxy &&
                           !conn->bits.httpproxy) ? TRUE : FALSE;

  if(data->set.str[STRING_PRE_PROXY] && *data->set.str[STRING_PRE_PROXY]) {
    conn->bits.proxy = TRUE;
    conn->bits.socksproxy = TRUE;
  }

  conn->bits.proxy_user_passwd =
    (data->set.str[STRING_PROXYUSERNAME]) ? TRUE : FALSE;
  conn->bits.tunnel_proxy = data->set.tunnel_thru_httpproxy;

#endif /* CURL_DISABLE_PROXY */

  conn->bits.user_passwd = (data->set.str[STRING_USERNAME]) ? TRUE : FALSE;
  conn->bits.ftp_use_epsv = data->set.ftp_use_epsv;
  conn->bits.ftp_use_eprt = data->set.ftp_use_eprt;

  conn->ssl_config.verifystatus = data->set.ssl.primary.verifystatus;
  conn->ssl_config.verifypeer = data->set.ssl.primary.verifypeer;
  conn->ssl_config.verifyhost = data->set.ssl.primary.verifyhost;
  conn->proxy_ssl_config.verifystatus =
    data->set.proxy_ssl.primary.verifystatus;
  conn->proxy_ssl_config.verifypeer = data->set.proxy_ssl.primary.verifypeer;
  conn->proxy_ssl_config.verifyhost = data->set.proxy_ssl.primary.verifyhost;

  conn->ip_version = data->set.ipver;

#if !defined(CURL_DISABLE_HTTP) && defined(USE_NTLM) && \
    defined(NTLM_WB_ENABLED)
  conn->ntlm_auth_hlpr_socket = CURL_SOCKET_BAD;
  conn->ntlm_auth_hlpr_pid = 0;
  conn->challenge_header = NULL;
  conn->response_header = NULL;
#endif

  if(Curl_pipeline_wanted(data->multi, CURLPIPE_HTTP1) &&
     !conn->master_buffer) {
    /* Allocate master_buffer to be used for HTTP/1 pipelining */
    conn->master_buffer = calloc(MASTERBUF_SIZE, sizeof(char));
    if(!conn->master_buffer)
      goto error;
  }

  /* Initialize the pipeline lists */
  Curl_llist_init(&conn->send_pipe, (curl_llist_dtor) llist_dtor);
  Curl_llist_init(&conn->recv_pipe, (curl_llist_dtor) llist_dtor);

#ifdef HAVE_GSSAPI
  conn->data_prot = PROT_CLEAR;
#endif

  /* Store the local bind parameters that will be used for this connection */
  if(data->set.str[STRING_DEVICE]) {
    conn->localdev = strdup(data->set.str[STRING_DEVICE]);
    if(!conn->localdev)
      goto error;
  }
  conn->localportrange = data->set.localportrange;
  conn->localport = data->set.localport;

  /* the close socket stuff needs to be copied to the connection struct as
     it may live on without (this specific) Curl_easy */
  conn->fclosesocket = data->set.fclosesocket;
  conn->closesocket_client = data->set.closesocket_client;

  return conn;
  error:

  Curl_llist_destroy(&conn->send_pipe, NULL);
  Curl_llist_destroy(&conn->recv_pipe, NULL);

  free(conn->master_buffer);
  free(conn->localdev);
#ifdef USE_SSL
  free(conn->ssl_extra);
#endif
  free(conn);
  return NULL;
}